

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::transpose
          (View<int,_true,_std::allocator<unsigned_long>_> *this,size_t c1,size_t c2)

{
  geometry_type *this_00;
  size_t sVar1;
  unsigned_long *begin;
  bool assertion;
  size_t sVar2;
  size_t *psVar3;
  
  testInvariant(this);
  sVar2 = dimension(this);
  if (sVar2 != 0) {
    sVar2 = dimension(this);
    if (c1 < sVar2) {
      sVar2 = dimension(this);
      assertion = c2 < sVar2;
      goto LAB_001c5f41;
    }
  }
  assertion = false;
LAB_001c5f41:
  marray_detail::Assert<bool>(assertion);
  this_00 = &this->geometry_;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,c2);
  sVar2 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,c1);
  sVar1 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,c2);
  *psVar3 = sVar1;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,c1);
  *psVar3 = sVar2;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,c2);
  sVar2 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,c1);
  sVar1 = *psVar3;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,c2);
  *psVar3 = sVar1;
  psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,c1);
  *psVar3 = sVar2;
  begin = (this->geometry_).shape_;
  marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
            (begin,begin + (this->geometry_).dimension_,(this->geometry_).shapeStrides_,
             &(this->geometry_).coordinateOrder_);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::updateSimplicity(this_00);
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::transpose
(
    const std::size_t c1,
    const std::size_t c2
)
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST ||
        (dimension() != 0 && c1 < dimension() && c2 < dimension()));

    std::size_t j1 = c1;
    std::size_t j2 = c2;
    std::size_t c;
    std::size_t d;

    // transpose shape
    c = geometry_.shape(j2);
    geometry_.shape(j2) = geometry_.shape(j1);
    geometry_.shape(j1) = c;

    // transpose strides
    d = geometry_.strides(j2);
    geometry_.strides(j2) = geometry_.strides(j1);
    geometry_.strides(j1) = d;

    // update shape strides
    marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(),
        geometry_.shapeStridesBegin(), geometry_.coordinateOrder());

    updateSimplicity();
    testInvariant();
}